

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_0::ValueProductMapKeyComparator::IsMatch
          (ValueProductMapKeyComparator *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  int iVar1;
  int32_t iVar2;
  Descriptor *this_00;
  int local_68;
  int local_64;
  int i_1;
  int i;
  int result2;
  int result1;
  FieldDescriptor *local_48;
  FieldDescriptor *ra_field;
  Reflection *reflection2;
  Reflection *reflection1;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  Message *pMStack_20;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  ValueProductMapKeyComparator *this_local;
  
  reflection1 = (Reflection *)parent_fields;
  parent_fields_local._4_4_ = unpacked_any;
  pMStack_20 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  reflection2 = Message::GetReflection(message1);
  ra_field = (FieldDescriptor *)Message::GetReflection(pMStack_20);
  this_00 = Message::GetDescriptor(message2_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&result2,"ra");
  local_48 = Descriptor::FindFieldByName(this_00,_result2);
  i = 1;
  i_1 = 1;
  local_64 = 0;
  while( true ) {
    iVar1 = Reflection::FieldSize(reflection2,message2_local,local_48);
    if (iVar1 <= local_64) break;
    iVar2 = Reflection::GetRepeatedInt32(reflection2,message2_local,local_48,local_64);
    i = iVar2 * i;
    local_64 = local_64 + 1;
  }
  local_68 = 0;
  while( true ) {
    iVar1 = Reflection::FieldSize((Reflection *)ra_field,pMStack_20,local_48);
    if (iVar1 <= local_68) break;
    iVar2 = Reflection::GetRepeatedInt32((Reflection *)ra_field,pMStack_20,local_48,local_68);
    i_1 = iVar2 * i_1;
    local_68 = local_68 + 1;
  }
  return i == i_1;
}

Assistant:

bool IsMatch(const Message& message1, const Message& message2,
               int unpacked_any,
               const std::vector<SpecificField>& parent_fields) const override {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    // FieldDescriptor for item.ra
    const FieldDescriptor* ra_field =
        message1.GetDescriptor()->FindFieldByName("ra");
    // Get the product of all elements in item.ra
    int result1 = 1, result2 = 1;
    for (int i = 0; i < reflection1->FieldSize(message1, ra_field); ++i) {
      result1 *= reflection1->GetRepeatedInt32(message1, ra_field, i);
    }
    for (int i = 0; i < reflection2->FieldSize(message2, ra_field); ++i) {
      result2 *= reflection2->GetRepeatedInt32(message2, ra_field, i);
    }
    return result1 == result2;
  }